

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

void Ga2_ManReportMemory(Ga2_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  int level;
  Vec_Vec_t *p_00;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  
  pVVar4 = p->pGia->vMapping;
  dVar12 = 0.0;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    iVar1 = pVVar4->nCap;
    auVar11._8_4_ = iVar1 >> 0x1f;
    auVar11._0_8_ = (long)iVar1;
    auVar11._12_4_ = 0x45300000;
    dVar12 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0)) * 4.0 + 16.0;
  }
  iVar1 = p->pGia->nObjsAlloc;
  dVar6 = sat_solver2_memory(p->pSat,1);
  dVar7 = sat_solver2_memory_proof(p->pSat);
  dVar8 = Vec_VecMemoryInt((Vec_Vec_t *)p->vId2Lit);
  dVar9 = Rnm_ManMemoryUsage(p->pRnm);
  iVar2 = p->nTable;
  p_00 = (Vec_Vec_t *)p->vCnfs;
  dVar10 = Vec_VecMemoryInt(p_00);
  level = (int)p_00;
  dVar25 = 0.0;
  if (p->vIds != (Vec_Int_t *)0x0) {
    iVar3 = p->vIds->nCap;
    auVar14._8_4_ = iVar3 >> 0x1f;
    auVar14._0_8_ = (long)iVar3;
    auVar14._12_4_ = 0x45300000;
    dVar25 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar3) - 4503599627370496.0)) * 4.0 + 16.0;
  }
  dVar13 = 0.0;
  dVar15 = 0.0;
  if (p->vProofIds != (Vec_Int_t *)0x0) {
    iVar3 = p->vProofIds->nCap;
    auVar18._8_4_ = iVar3 >> 0x1f;
    auVar18._0_8_ = (long)iVar3;
    auVar18._12_4_ = 0x45300000;
    dVar15 = ((auVar18._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar3) - 4503599627370496.0)) * 4.0 + 16.0;
  }
  if (p->vAbs != (Vec_Int_t *)0x0) {
    iVar3 = p->vAbs->nCap;
    auVar19._8_4_ = iVar3 >> 0x1f;
    auVar19._0_8_ = (long)iVar3;
    auVar19._12_4_ = 0x45300000;
    dVar13 = ((auVar19._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar3) - 4503599627370496.0)) * 4.0 + 16.0;
  }
  dVar17 = 0.0;
  dVar20 = 0.0;
  if (p->vValues != (Vec_Int_t *)0x0) {
    iVar3 = p->vValues->nCap;
    auVar22._8_4_ = iVar3 >> 0x1f;
    auVar22._0_8_ = (long)iVar3;
    auVar22._12_4_ = 0x45300000;
    dVar20 = ((auVar22._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar3) - 4503599627370496.0)) * 4.0 + 16.0;
  }
  if (p->vLits != (Vec_Int_t *)0x0) {
    iVar3 = p->vLits->nCap;
    auVar23._8_4_ = iVar3 >> 0x1f;
    auVar23._0_8_ = (long)iVar3;
    auVar23._12_4_ = 0x45300000;
    dVar17 = ((auVar23._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar3) - 4503599627370496.0)) * 4.0 + 16.0;
  }
  dVar21 = 0.0;
  if (p->vIsopMem != (Vec_Int_t *)0x0) {
    iVar3 = p->vIsopMem->nCap;
    auVar24._8_4_ = iVar3 >> 0x1f;
    auVar24._0_8_ = (long)iVar3;
    auVar24._12_4_ = 0x45300000;
    dVar21 = ((auVar24._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar3) - 4503599627370496.0)) * 4.0 + 16.0;
  }
  lVar5 = (long)iVar2 * 0x18;
  auVar16._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar16._0_8_ = lVar5;
  auVar16._12_4_ = 0x45300000;
  dVar12 = (double)iVar1 * 12.0 + dVar12;
  dVar7 = (auVar16._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0) +
          dVar9 + dVar8 + dVar7 + dVar6 + dVar12 +
          dVar21 + dVar17 + dVar20 + dVar13 + dVar10 + 224.0 + dVar25 + dVar15 + 926274.0;
  Abc_Print(level,"%s =","Memory: AIG      ");
  dVar6 = (dVar12 * 100.0) / dVar7;
  if ((dVar7 == 0.0) && (!NAN(dVar7))) {
    dVar6 = 0.0;
  }
  dVar8 = (dVar7 * 100.0) / dVar7;
  if ((dVar7 == 0.0) && (!NAN(dVar7))) {
    dVar8 = 0.0;
  }
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar12 * 9.5367431640625e-07,dVar6);
  Abc_Print(level,"%s =","Memory: SAT      ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n");
  Abc_Print(level,"%s =","Memory: Proof    ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n");
  Abc_Print(level,"%s =","Memory: Map      ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n");
  Abc_Print(level,"%s =","Memory: Refine   ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n");
  Abc_Print(level,"%s =","Memory: Hash     ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n");
  Abc_Print(level,"%s =","Memory: Other    ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n");
  Abc_Print(level,"%s =","Memory: TOTAL    ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar7 * 9.5367431640625e-07,dVar8);
  return;
}

Assistant:

void Ga2_ManReportMemory( Ga2_Man_t * p )
{
    double memTot = 0;
    double memAig = 1.0 * p->pGia->nObjsAlloc * sizeof(Gia_Obj_t) + Vec_IntMemory(p->pGia->vMapping);
    double memSat = sat_solver2_memory( p->pSat, 1 );
    double memPro = sat_solver2_memory_proof( p->pSat );
    double memMap = Vec_VecMemoryInt( (Vec_Vec_t *)p->vId2Lit );
    double memRef = Rnm_ManMemoryUsage( p->pRnm );
    double memHash= sizeof(int) * 6 * p->nTable;
    double memOth = sizeof(Ga2_Man_t);
    memOth += Vec_VecMemoryInt( (Vec_Vec_t *)p->vCnfs );
    memOth += Vec_IntMemory( p->vIds );
    memOth += Vec_IntMemory( p->vProofIds );
    memOth += Vec_IntMemory( p->vAbs );
    memOth += Vec_IntMemory( p->vValues );
    memOth += Vec_IntMemory( p->vLits );
    memOth += Vec_IntMemory( p->vIsopMem );
    memOth += 336450 + (sizeof(char) + sizeof(char*)) * 65536;
    memTot = memAig + memSat + memPro + memMap + memRef + memHash + memOth;
    ABC_PRMP( "Memory: AIG      ", memAig, memTot );
    ABC_PRMP( "Memory: SAT      ", memSat, memTot );
    ABC_PRMP( "Memory: Proof    ", memPro, memTot );
    ABC_PRMP( "Memory: Map      ", memMap, memTot );
    ABC_PRMP( "Memory: Refine   ", memRef, memTot );
    ABC_PRMP( "Memory: Hash     ", memHash,memTot );
    ABC_PRMP( "Memory: Other    ", memOth, memTot );
    ABC_PRMP( "Memory: TOTAL    ", memTot, memTot );
}